

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rehash.cpp
# Opt level: O0

void __thiscall Jupiter::Rehashable::~Rehashable(Rehashable *this)

{
  bool bVar1;
  reference ppRVar2;
  const_iterator local_28;
  _Self local_20;
  _Self local_18;
  iterator node;
  Rehashable *this_local;
  
  this->_vptr_Rehashable = (_func_int **)&PTR___cxa_pure_virtual_001ea7b8;
  node._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>::begin
                 (&o_rehashables_abi_cxx11_);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>::end
                   (&o_rehashables_abi_cxx11_);
    bVar1 = std::operator==(&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    ppRVar2 = std::_List_iterator<Jupiter::Rehashable_*>::operator*(&local_18);
    if (*ppRVar2 == this) break;
    std::_List_iterator<Jupiter::Rehashable_*>::operator++(&local_18);
  }
  std::_List_const_iterator<Jupiter::Rehashable_*>::_List_const_iterator(&local_28,&local_18);
  std::__cxx11::list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>::erase
            (&o_rehashables_abi_cxx11_,local_28);
  return;
}

Assistant:

Jupiter::Rehashable::~Rehashable()
{
	for (auto node = o_rehashables.begin(); node != o_rehashables.end(); ++node)
	{
		if (*node == this)
		{
			o_rehashables.erase(node);
			break;
		}
	}
}